

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

cmJSONHelper<int> * cmJSONHelperBuilder::Int(cmJSONHelper<int> *__return_storage_ptr__,int defval)

{
  ErrorGenerator local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_INT;
  local_28._M_invoker =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
       ::_M_manager;
  Int(__return_storage_ptr__,&local_28,defval);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<int> Int(int defval)
  {
    return Int(JsonErrors::INVALID_INT, defval);
  }